

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

void TakeScreenshot(char *fileName)

{
  Image image_00;
  anon_struct_8_1_814e3414_for_Storage aVar1;
  int iVar2;
  char *pcVar3;
  uchar *__ptr;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  float fVar8;
  float fVar9;
  Image image;
  char path [512];
  float local_228 [128];
  
  pcVar3 = strchr(fileName,0x27);
  if (pcVar3 != (char *)0x0) {
    TraceLog(4,"SYSTEM: Provided fileName could be potentially malicious, avoid [\'] character");
    return;
  }
  local_228[0] = 0.0;
  local_228[1] = 0.0;
  glfwGetWindowContentScale(platform.handle,local_228,local_228 + 1);
  fVar8 = (float)local_228._0_8_;
  fVar9 = SUB84(local_228._0_8_,4);
  __ptr = rlReadScreenPixels((int)((float)CORE.Window.render.width * fVar8),
                             (int)((float)CORE.Window.render.height * fVar9));
  uVar5 = (ulong)CORE.Window.render.width;
  uVar6 = (ulong)CORE.Window.render.height;
  pcVar3 = (char *)0x0;
  memset(local_228,0,0x200);
  aVar1 = CORE.Storage;
  if (fileName != (char *)0x0) {
    pcVar4 = (char *)0x0;
    pcVar7 = fileName;
    do {
      pcVar3 = pcVar4;
      pcVar4 = strpbrk(pcVar7,"\\/");
      pcVar7 = pcVar4 + 1;
    } while (pcVar4 != (char *)0x0);
  }
  pcVar7 = pcVar3 + 1;
  if (pcVar3 == (char *)0x0) {
    pcVar7 = fileName;
  }
  pcVar3 = TextFormat("%s/%s",aVar1.basePath,pcVar7);
  strcpy((char *)local_228,pcVar3);
  image_00.height = (int)((float)uVar6 * fVar9);
  image_00.width = (int)((float)uVar5 * fVar8);
  image_00.data = __ptr;
  image_00.mipmaps = 1;
  image_00.format = 7;
  ExportImage(image_00,(char *)local_228);
  free(__ptr);
  iVar2 = access((char *)local_228,0);
  if (iVar2 == -1) {
    pcVar3 = "SYSTEM: [%s] Screenshot could not be saved";
    iVar2 = 4;
  }
  else {
    pcVar3 = "SYSTEM: [%s] Screenshot taken successfully";
    iVar2 = 3;
  }
  TraceLog(iVar2,pcVar3,local_228);
  return;
}

Assistant:

void TakeScreenshot(const char *fileName)
{
#if defined(SUPPORT_MODULE_RTEXTURES)
    // Security check to (partially) avoid malicious code
    if (strchr(fileName, '\'') != NULL) { TRACELOG(LOG_WARNING, "SYSTEM: Provided fileName could be potentially malicious, avoid [\'] character"); return; }

    Vector2 scale = GetWindowScaleDPI();
    unsigned char *imgData = rlReadScreenPixels((int)((float)CORE.Window.render.width*scale.x), (int)((float)CORE.Window.render.height*scale.y));
    Image image = { imgData, (int)((float)CORE.Window.render.width*scale.x), (int)((float)CORE.Window.render.height*scale.y), 1, PIXELFORMAT_UNCOMPRESSED_R8G8B8A8 };

    char path[512] = { 0 };
    strcpy(path, TextFormat("%s/%s", CORE.Storage.basePath, GetFileName(fileName)));

    ExportImage(image, path);           // WARNING: Module required: rtextures
    RL_FREE(imgData);

    if (FileExists(path)) TRACELOG(LOG_INFO, "SYSTEM: [%s] Screenshot taken successfully", path);
    else TRACELOG(LOG_WARNING, "SYSTEM: [%s] Screenshot could not be saved", path);
#else
    TRACELOG(LOG_WARNING,"IMAGE: ExportImage() requires module: rtextures");
#endif
}